

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::DynamicMapField::InsertOrLookupMapValue
          (DynamicMapField *this,MapKey *map_key,MapValueRef *val)

{
  int iVar1;
  undefined4 extraout_var;
  MapValueRef *map_val;
  pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
  local_40;
  
  iVar1 = (*(this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase[0x14])();
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::FindHelper
            (&local_40,*(InnerMap **)(CONCAT44(extraout_var,iVar1) + 0x10),map_key,
             (TreeIterator *)0x0);
  if (local_40.first.node_ == (Node *)0x0) {
    map_val = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                        (&this->map_,map_key);
    AllocateMapValue(this,map_val);
  }
  else {
    map_val = &(((local_40.first.node_)->kv).v_)->second;
  }
  val->type_ = map_val->type_;
  val->data_ = map_val->data_;
  return local_40.first.node_ == (Node *)0x0;
}

Assistant:

bool DynamicMapField::InsertOrLookupMapValue(const MapKey& map_key,
                                             MapValueRef* val) {
  // Always use mutable map because users may change the map value by
  // MapValueRef.
  Map<MapKey, MapValueRef>* map = MutableMap();
  Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
  if (iter == map->end()) {
    MapValueRef& map_val = map_[map_key];
    AllocateMapValue(&map_val);
    val->CopyFrom(map_val);
    return true;
  }
  // map_key is already in the map. Make sure (*map)[map_key] is not called.
  // [] may reorder the map and iterators.
  val->CopyFrom(iter->second);
  return false;
}